

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O3

qcc_generator_ptr
qcc_gen_value_from(qcc_context *ctx,size_t item_size,size_t item_stride,void *data,size_t count)

{
  qcc_generator_ptr pqVar1;
  
  pqVar1 = (qcc_generator_ptr)qcc_arena_alloc(ctx->arena,0x30);
  pqVar1->context = ctx;
  pqVar1->type_size = item_size;
  pqVar1->generate = qcc_generate_value_from;
  pqVar1[1].context = (qcc_context *)item_stride;
  pqVar1[1].type_size = (size_t)data;
  pqVar1[1].generate = (qcc_generate_fn)count;
  return pqVar1;
}

Assistant:

qcc_generator_ptr qcc_gen_value_from(struct qcc_context *ctx, size_t item_size,
                                     size_t item_stride, const void *data,
                                     size_t count)
{
    QCC_ARENA_POD(ctx->arena, qcc_generator_value_from, res);
    res->base.context = ctx;
    res->base.type_size = item_size;
    res->base.generate = qcc_generate_value_from;
    res->stride = item_stride;
    res->data = (const uint8_t *)data;
    res->count = count;
    return &res->base;
}